

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

size_t xmlBufShrink(xmlBufPtr buf,size_t len)

{
  ulong uVar1;
  size_t start_buf;
  size_t len_local;
  xmlBufPtr buf_local;
  
  if ((buf == (xmlBufPtr)0x0) || (buf->error != 0)) {
    buf_local = (xmlBufPtr)0x0;
  }
  else {
    if ((buf->size != (ulong)buf->compat_size) && (buf->compat_size < 0x7fffffff)) {
      buf->size = (ulong)buf->compat_size;
    }
    if ((buf->use != (ulong)buf->compat_use) && (buf->compat_use < 0x7fffffff)) {
      buf->use = (ulong)buf->compat_use;
    }
    if (len == 0) {
      buf_local = (xmlBufPtr)0x0;
    }
    else if (buf->use < len) {
      buf_local = (xmlBufPtr)0x0;
    }
    else {
      buf->use = buf->use - len;
      if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
         ((buf->alloc == XML_BUFFER_ALLOC_IO && (buf->contentIO != (xmlChar *)0x0)))) {
        buf->content = buf->content + len;
        buf->size = buf->size - len;
        if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
           ((buf->contentIO != (xmlChar *)0x0 &&
            (uVar1 = (long)buf->content - (long)buf->contentIO, buf->size <= uVar1)))) {
          memmove(buf->contentIO,buf->content,buf->use);
          buf->content = buf->contentIO;
          buf->content[buf->use] = '\0';
          buf->size = uVar1 + buf->size;
        }
      }
      else {
        memmove(buf->content,buf->content + len,buf->use);
        buf->content[buf->use] = '\0';
      }
      if (buf->size < 0x7fffffff) {
        buf->compat_size = (uint)buf->size;
      }
      else {
        buf->compat_size = 0x7fffffff;
      }
      buf_local = (xmlBufPtr)len;
      if (buf->use < 0x7fffffff) {
        buf->compat_use = (uint)buf->use;
      }
      else {
        buf->compat_use = 0x7fffffff;
      }
    }
  }
  return (size_t)buf_local;
}

Assistant:

size_t
xmlBufShrink(xmlBufPtr buf, size_t len) {
    if ((buf == NULL) || (buf->error != 0)) return(0);
    CHECK_COMPAT(buf)
    if (len == 0) return(0);
    if (len > buf->use) return(0);

    buf->use -= len;
    if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
        ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL))) {
	/*
	 * we just move the content pointer, but also make sure
	 * the perceived buffer size has shrunk accordingly
	 */
        buf->content += len;
	buf->size -= len;

        /*
	 * sometimes though it maybe be better to really shrink
	 * on IO buffers
	 */
	if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
	    size_t start_buf = buf->content - buf->contentIO;
	    if (start_buf >= buf->size) {
		memmove(buf->contentIO, &buf->content[0], buf->use);
		buf->content = buf->contentIO;
		buf->content[buf->use] = 0;
		buf->size += start_buf;
	    }
	}
    } else {
	memmove(buf->content, &buf->content[len], buf->use);
	buf->content[buf->use] = 0;
    }
    UPDATE_COMPAT(buf)
    return(len);
}